

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsSetModuleHostInfo(JsModuleRecord requestModule,JsModuleHostInfoKind moduleHostInfo,void *hostInfo)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  JsrtContext *pJVar4;
  JsrtContext *context;
  undefined4 *puVar5;
  Type *pTVar6;
  JsErrorCode JVar7;
  SourceTextModuleRecord *unaff_R13;
  Type *addr;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  TTDebuggerAbortException anon_var_0;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((requestModule == (JsModuleRecord)0x0) || (*(int *)((long)requestModule + 8) != 0x65646f4d)) {
    if ((moduleHostInfo < JsModuleHostInfo_InitializeImportMetaCallback) &&
       ((0x46U >> (moduleHostInfo & 0x1f) & 1) != 0)) {
      return JsErrorInvalidArgument;
    }
    pJVar4 = JsrtContext::GetCurrent();
    pTVar6 = &(((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext;
  }
  else {
    unaff_R13 = Js::SourceTextModuleRecord::FromHost(requestModule);
    pTVar6 = &unaff_R13->scriptContext;
  }
  pJVar4 = (JsrtContext *)
           Js::JavascriptLibrary::GetJsrtContext
                     ((pTVar6->ptr->super_ScriptContextBase).javascriptLibrary);
  context = JsrtContext::GetCurrent();
  scriptContext = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                      ExceptionType_OutOfMemory);
  bVar2 = JsrtContext::TrySetCurrent(pJVar4);
  JVar7 = JsErrorWrongThread;
  if (!bVar2) goto LAB_003c23bb;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_a0,scriptContext,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
  pJVar4 = JsrtContext::GetCurrent();
  switch(moduleHostInfo) {
  case JsModuleHostInfo_Exception:
    HVar3 = Js::SourceTextModuleRecord::OnHostException(unaff_R13,hostInfo);
    JVar7 = JsErrorInvalidArgument;
    if (HVar3 == 0) {
      JVar7 = JsNoError;
    }
    goto LAB_003c23af;
  case JsModuleHostInfo_HostDefined:
    addr = &unaff_R13->hostDefined;
    Memory::Recycler::WBSetBit((char *)addr);
    goto LAB_003c2393;
  case JsModuleHostInfo_NotifyModuleReadyCallback:
    pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[4] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_FetchImportedModuleCallback:
    pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[2] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
    pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[3] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_Url:
    addr = &unaff_R13->normalizedSpecifier;
    Memory::Recycler::WBSetBit((char *)addr);
LAB_003c2393:
    addr->ptr = hostInfo;
    JVar7 = JsNoError;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    goto LAB_003c23af;
  case JsModuleHostInfo_InitializeImportMetaCallback:
    pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[5] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_ReportModuleCompletionCallback:
    pJVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6] =
         (_func_int *)hostInfo;
    break;
  default:
    JVar7 = JsInvalidModuleHostInfoKind;
    goto LAB_003c23af;
  }
  JVar7 = JsNoError;
LAB_003c23af:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
LAB_003c23bb:
  if ((JVar7 - JsErrorNoCurrentContext < 7) &&
     ((0x43U >> (JVar7 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x171,
                       "(errorCode != JsErrorFatal && errorCode != JsErrorNoCurrentContext && errorCode != JsErrorInExceptionState && errorCode != JsErrorInDisabledState && errorCode != JsErrorOutOfMemory && errorCode != JsErrorScriptException && errorCode != JsErrorScriptTerminated)"
                       ,
                       "errorCode != JsErrorFatal && errorCode != JsErrorNoCurrentContext && errorCode != JsErrorInExceptionState && errorCode != JsErrorInDisabledState && errorCode != JsErrorOutOfMemory && errorCode != JsErrorScriptException && errorCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JsrtContext::TrySetCurrent(context);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library);
  return JVar7;
}

Assistant:

CHAKRA_API
JsSetModuleHostInfo(
    _In_opt_ JsModuleRecord requestModule,
    _In_ JsModuleHostInfoKind moduleHostInfo,
    _In_ void* hostInfo)
{
    Js::ScriptContext* scriptContext;
    Js::SourceTextModuleRecord* moduleRecord;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        if (moduleHostInfo == JsModuleHostInfo_Exception ||
            moduleHostInfo == JsModuleHostInfo_HostDefined ||
            moduleHostInfo == JsModuleHostInfo_Url)
        {
            return JsErrorInvalidArgument;
        }
        scriptContext = JsrtContext::GetCurrent()->GetScriptContext();
    }
    else
    {
        moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
        scriptContext = moduleRecord->GetScriptContext();
    }
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        JsrtContextCore* currentContext = static_cast<JsrtContextCore*>(JsrtContextCore::GetCurrent());
        switch (moduleHostInfo)
        {
        case JsModuleHostInfo_Exception:
            {
            HRESULT hr = moduleRecord->OnHostException(hostInfo);
            return (hr == NOERROR) ? JsNoError : JsErrorInvalidArgument;
            }
        case JsModuleHostInfo_HostDefined:
            moduleRecord->SetHostDefined(hostInfo);
            break;
        case JsModuleHostInfo_FetchImportedModuleCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleCallback(reinterpret_cast<FetchImportedModuleCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleFromScriptCallback(reinterpret_cast<FetchImportedModuleFromScriptCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_NotifyModuleReadyCallback:
            currentContext->GetHostScriptContext()->SetNotifyModuleReadyCallback(reinterpret_cast<NotifyModuleReadyCallback>(hostInfo));
            break;
        case JsModuleHostInfo_InitializeImportMetaCallback:
            currentContext->GetHostScriptContext()->SetInitializeImportMetaCallback(reinterpret_cast<InitializeImportMetaCallback>(hostInfo));
            break;
        case JsModuleHostInfo_ReportModuleCompletionCallback:
            currentContext->GetHostScriptContext()->SetReportModuleCompletionCallback(reinterpret_cast<ReportModuleCompletionCallback>(hostInfo));
            break;
        case JsModuleHostInfo_Url:
            moduleRecord->SetSpecifier(hostInfo);
            break;
        default:
            return JsInvalidModuleHostInfoKind;
        };
        return JsNoError;
    });
    return errorCode;
}